

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O0

Hop_Obj_t * Ver_FormulaParserTopOper(Hop_Man_t *pMan,Vec_Ptr_t *vStackFn,int Oper)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *p1;
  Hop_Obj_t *pC;
  Hop_Obj_t *local_48;
  Hop_Obj_t *bFunc;
  Hop_Obj_t *bArg2;
  Hop_Obj_t *bArg1;
  Hop_Obj_t *bArg0;
  int Oper_local;
  Vec_Ptr_t *vStackFn_local;
  Hop_Man_t *pMan_local;
  
  pHVar1 = (Hop_Obj_t *)Vec_PtrPop(vStackFn);
  p1 = (Hop_Obj_t *)Vec_PtrPop(vStackFn);
  if (Oper == 6) {
    local_48 = Hop_And(pMan,p1,pHVar1);
  }
  else if (Oper == 5) {
    local_48 = Hop_Exor(pMan,p1,pHVar1);
  }
  else if (Oper == 4) {
    local_48 = Hop_Or(pMan,p1,pHVar1);
  }
  else if (Oper == 3) {
    pHVar1 = Hop_Exor(pMan,p1,pHVar1);
    local_48 = Hop_Not(pHVar1);
  }
  else {
    if (Oper != 2) {
      return (Hop_Obj_t *)0x0;
    }
    pC = (Hop_Obj_t *)Vec_PtrPop(vStackFn);
    local_48 = Hop_Mux(pMan,pC,p1,pHVar1);
  }
  Vec_PtrPush(vStackFn,local_48);
  return local_48;
}

Assistant:

Hop_Obj_t * Ver_FormulaParserTopOper( Hop_Man_t * pMan, Vec_Ptr_t * vStackFn, int Oper )
{
    Hop_Obj_t * bArg0, * bArg1, * bArg2, * bFunc;
    // perform the given operation
    bArg2 = (Hop_Obj_t *)Vec_PtrPop( vStackFn );
    bArg1 = (Hop_Obj_t *)Vec_PtrPop( vStackFn );
    if ( Oper == VER_PARSE_OPER_AND )
        bFunc = Hop_And( pMan, bArg1, bArg2 );
    else if ( Oper == VER_PARSE_OPER_XOR )
        bFunc = Hop_Exor( pMan, bArg1, bArg2 );
    else if ( Oper == VER_PARSE_OPER_OR )
        bFunc = Hop_Or( pMan, bArg1, bArg2 );
    else if ( Oper == VER_PARSE_OPER_EQU )
        bFunc = Hop_Not( Hop_Exor( pMan, bArg1, bArg2 ) );
    else if ( Oper == VER_PARSE_OPER_MUX )
    {
        bArg0 = (Hop_Obj_t *)Vec_PtrPop( vStackFn );
//        bFunc = Cudd_bddIte( dd, bArg0, bArg1, bArg2 );  Cudd_Ref( bFunc );
        bFunc = Hop_Mux( pMan, bArg0, bArg1, bArg2 ); 
//        Cudd_RecursiveDeref( dd, bArg0 );
//        Cudd_Deref( bFunc );
    }
    else
        return NULL;
//    Cudd_Ref( bFunc );
//    Cudd_RecursiveDeref( dd, bArg1 );
//    Cudd_RecursiveDeref( dd, bArg2 );
    Vec_PtrPush( vStackFn,  bFunc );
    return bFunc;
}